

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_arr_free_(void **pp)

{
  void *pvVar1;
  stb__arr *q;
  void *p;
  void **pp_local;
  
  pvVar1 = *pp;
  if (pvVar1 != (void *)0x0) {
    if (*(int *)((long)pvVar1 + -8) == 0) {
      free((void *)((long)pvVar1 + -0x10));
    }
    else {
      stb_free((void *)((long)pvVar1 + -0x10));
    }
  }
  *pp = (void *)0x0;
  return;
}

Assistant:

void stb_arr_free_(void **pp)
{
   void *p = *pp;
   stb_arr_check2(p);
   if (p) {
      stb__arr *q = stb_arrhead2(p);
      if (q->stb_malloc)
         stb_free(q);
      else
         free(q);
   }
   *pp = NULL;
}